

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O0

int __thiscall
SOCK5ConnectionMaker::exchange_data(SOCK5ConnectionMaker *this,fd_set *rdfds,fd_set *wrfds)

{
  ssize_t sVar1;
  int *piVar2;
  __cxx11 local_188 [4];
  int err;
  __cxx11 local_168 [32];
  __cxx11 local_148 [48];
  __cxx11 local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [36];
  int local_34;
  uint local_30;
  int i_1;
  int k;
  int i;
  fd_set *wrfds_local;
  fd_set *rdfds_local;
  SOCK5ConnectionMaker *this_local;
  
  if ((this->drop & 1U) != 0) {
    return 0;
  }
  _k = wrfds;
  wrfds_local = rdfds;
  rdfds_local = (fd_set *)this;
  if (((rdfds->fds_bits[this->client_sock_ / 0x40] &
       1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f)) != 0) && (this->outputbuf_size == 0))
  {
    sVar1 = recv(this->client_sock_,this->inputbuf,0x400,0);
    this->inputbuf_size = (int)sVar1;
    if (this->inputbuf_size == 0) {
      this->drop = true;
      return 1;
    }
    if ((this->inputbuf_size == -1) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      this->drop = true;
      return 0;
    }
    if (((this->firstStepCompleted & 1U) == 0) && (0 < this->inputbuf_size)) {
      this->outputbuf_size = 2;
      this->outputbuf[0] = '\x05';
      this->outputbuf[1] = 0xff;
      for (i_1 = 0; i_1 < (int)(uint)this->inputbuf[1]; i_1 = i_1 + 1) {
        if (this->inputbuf[i_1 + 2] == '\0') {
          this->outputbuf[1] = '\0';
        }
      }
    }
    else {
      this->outputbuf_size = 10;
      this->outputbuf[0] = '\x05';
      this->outputbuf[1] = '\0';
      this->outputbuf[2] = '\0';
      this->outputbuf[3] = '\x01';
      this->outputbuf[4] = '\x7f';
      this->outputbuf[5] = '\0';
      this->outputbuf[6] = '\0';
      this->outputbuf[7] = '\x01';
      this->outputbuf[8] = (uchar)this->port;
      this->outputbuf[9] = *(uchar *)((long)&this->port + 1);
      if (this->inputbuf[0] != '\x05') {
        this->outputbuf[1] = '\a';
      }
      if (this->inputbuf[1] != '\x01') {
        this->outputbuf[1] = '\a';
      }
      if (this->inputbuf[3] == '\x04') {
        this->outputbuf[1] = '\b';
      }
      if (this->inputbuf[3] == '\x03') {
        local_30 = (uint)this->inputbuf[4];
        this->domain = true;
        for (local_34 = 0; local_34 < (int)local_30; local_34 = local_34 + 1) {
          std::__cxx11::string::push_back((char)this + '\x18');
        }
        *(uchar *)((long)&this->port + 1) = this->inputbuf[(int)(local_30 + 5)];
        *(uchar *)&this->port = this->inputbuf[(int)(local_30 + 6)];
      }
      if (this->inputbuf[3] == '\x01') {
        this->domain = false;
        std::__cxx11::to_string(local_118,(uint)this->inputbuf[4]);
        std::operator+(local_f8,(char)local_118);
        std::__cxx11::to_string(local_148,(uint)this->inputbuf[5]);
        std::operator+(local_d8,local_f8);
        std::operator+(local_b8,(char)local_d8);
        std::__cxx11::to_string(local_168,(uint)this->inputbuf[6]);
        std::operator+(local_98,local_b8);
        std::operator+(local_78,(char)local_98);
        std::__cxx11::to_string(local_188,(uint)this->inputbuf[7]);
        std::operator+(local_58,local_78);
        std::__cxx11::string::operator+=((string *)&this->addr,(string *)local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)local_188);
        std::__cxx11::string::~string((string *)local_78);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)local_118);
        *(uchar *)((long)&this->port + 1) = this->inputbuf[8];
        *(uchar *)&this->port = this->inputbuf[9];
      }
    }
  }
  if (((_k->fds_bits[this->client_sock_ / 0x40] &
       1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f)) != 0) && (this->outputbuf_size != 0))
  {
    sVar1 = send(this->client_sock_,this->outputbuf,(long)this->outputbuf_size,0);
    this->outputbuf_size = 0;
    if (((int)sVar1 == 0) || (((int)sVar1 == -1 && (piVar2 = __errno_location(), *piVar2 != 0xb))))
    {
      this->drop = true;
    }
    if ((this->firstStepCompleted & 1U) != 0) {
      return 1;
    }
    this->firstStepCompleted = true;
  }
  return 0;
}

Assistant:

int SOCK5ConnectionMaker::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (drop) {
        return 0;
    }
    if (FD_ISSET(client_sock_, &rdfds) && outputbuf_size == 0) {
        inputbuf_size = recv(client_sock_, inputbuf, MAX_BUF_SIZE, 0);
        if (inputbuf_size == 0) {
            drop = true;
            return true;
        }
        if (inputbuf_size == -1 && errno != EWOULDBLOCK) {
            drop = true;
            return 0;
        }
        if (!firstStepCompleted && inputbuf_size > 0) {
            outputbuf_size = 2;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0xFF;
            for (int i = 0; i < inputbuf[1]; i++) { //auth methods
                if (inputbuf[i + 2] == 0x00) {
                    outputbuf[1] = 0x00;
                }
            }
        } else {
            outputbuf_size = 10;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0x00;
            outputbuf[2] = 0x00;
            outputbuf[3] = 0x01;
            //writing my ip
            outputbuf[4] = 127;
            outputbuf[5] = 0;
            outputbuf[6] = 0;
            outputbuf[7] = 1;
            //writing my port
            outputbuf[8] = ((unsigned char *) &port)[0];
            outputbuf[9] = ((unsigned char *) &port)[1];
            if (inputbuf[0] != 0x05) { //if SOCK4
                outputbuf[1] = 0x07;
            }
            if (inputbuf[1] != 0x01) { //if operation does'n support
                outputbuf[1] = 0x07;
            }
            if (inputbuf[3] == 0x04) { //if ipv6
                outputbuf[1] = 0x08;
            }
            if (inputbuf[3] == 0x03) { //if domain
                int k = inputbuf[4];
                domain = true;
                for (int i = 0; i < k; i++) {
                    addr.push_back(inputbuf[i + 5]);
                }
                ((unsigned char *) &port)[1] = inputbuf[k + 5];
                ((unsigned char *) &port)[0] = inputbuf[k + 6];
            }
            if (inputbuf[3] == 0x01) {//if ipv4
                domain = false;
                addr += std::to_string(inputbuf[4]) + '.' + std::to_string(inputbuf[5]) + '.' +
                        std::to_string(inputbuf[6]) + '.' + std::to_string(inputbuf[7]);
                ((unsigned char *) &port)[1] = inputbuf[8];
                ((unsigned char *) &port)[0] = inputbuf[9];
            }
        }
    }
    if (FD_ISSET(client_sock_, &wrfds) && outputbuf_size != 0) {
        int err = send(client_sock_, outputbuf, outputbuf_size, 0);
        outputbuf_size = 0;
        if (err == 0 || (err == -1 && errno != EWOULDBLOCK)) {
            drop = true;
        }
        if (!firstStepCompleted) {
            firstStepCompleted = true;
        } else {
            return 1;
        }
    }
    return 0;
}